

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O2

void __thiscall
swrenderer::DrawSlabPalCommand::Execute(DrawSlabPalCommand *this,DrawerThread *thread)

{
  uint8_t uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  uint8_t *puVar12;
  
  puVar12 = this->_p;
  iVar2 = this->_pitch;
  puVar5 = this->_colormap;
  puVar6 = this->_vvptr;
  uVar3 = *(uint *)&(this->super_PalSpanCommand).field_0x64;
  iVar9 = this->_v;
  iVar4 = this->_vi;
  iVar7 = DrawerThread::count_for_thread(thread,this->_start_y,this->_dy);
  iVar8 = DrawerThread::skipped_by_thread(thread,this->_start_y);
  puVar12 = puVar12 + iVar8 * iVar2;
  iVar8 = DrawerThread::skipped_by_thread(thread,this->_start_y);
  iVar9 = iVar8 * iVar4 + iVar9;
  iVar8 = thread->num_cores;
  uVar10 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar10 = 0;
  }
  for (; 0 < iVar7; iVar7 = iVar7 + -1) {
    uVar1 = puVar5[puVar6[iVar9 >> 0x10]];
    for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
      puVar12[uVar11] = uVar1;
    }
    puVar12 = puVar12 + iVar8 * iVar2;
    iVar9 = iVar9 + iVar4 * iVar8;
  }
  return;
}

Assistant:

void DrawSlabPalCommand::Execute(DrawerThread *thread)
	{
		int count = _dy;
		uint8_t *dest = _p;
		int pitch = _pitch;
		int width = _dx;
		const uint8_t *colormap = _colormap;
		const uint8_t *source = _vvptr;
		fixed_t fracpos = _v;
		fixed_t iscale = _vi;

		count = thread->count_for_thread(_start_y, count);
		dest = thread->dest_for_thread(_start_y, pitch, dest);
		fracpos += iscale * thread->skipped_by_thread(_start_y);
		iscale *= thread->num_cores;
		pitch *= thread->num_cores;

		while (count > 0)
		{
			uint8_t color = colormap[source[fracpos >> FRACBITS]];

			for (int x = 0; x < width; x++)
				dest[x] = color;

			dest += pitch;
			fracpos += iscale;
			count--;
		}
	}